

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector_senswrapper.c
# Opt level: O0

realtype N_VMin_SensWrapper(N_Vector x)

{
  realtype rVar1;
  realtype tmp;
  realtype min;
  int i;
  N_Vector x_local;
  
  tmp = N_VMin((N_Vector)**x->content);
  for (min._4_4_ = 1; min._4_4_ < *(int *)((long)x->content + 8); min._4_4_ = min._4_4_ + 1) {
    rVar1 = N_VMin(*(N_Vector *)(*x->content + (long)min._4_4_ * 8));
    if (rVar1 < tmp) {
      tmp = rVar1;
    }
  }
  return tmp;
}

Assistant:

realtype N_VMin_SensWrapper(N_Vector x)
{
  int i;
  realtype min, tmp;

  min = N_VMin(NV_VEC_SW(x,0));

  for (i=1; i < NV_NVECS_SW(x); i++) {
    tmp = N_VMin(NV_VEC_SW(x,i));
    if (tmp < min) min = tmp;
  }

  return(min);
}